

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O2

int Extra_ThreshSelectWeights6(word *t,int nVars,int *pW)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int m;
  ulong uVar11;
  
  if (nVars != 6) {
    __assert_fail("nVars == 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddThresh.c"
                  ,0xf3,"int Extra_ThreshSelectWeights6(word *, int, int *)");
  }
  iVar3 = 1;
  do {
    pW[5] = iVar3;
    iVar4 = iVar3;
    if (iVar3 == 10) {
      return 0;
    }
    for (; pW[4] = iVar4, iVar5 = iVar4, iVar4 != 10; iVar4 = iVar4 + 1) {
      for (; pW[3] = iVar5, iVar7 = iVar5, iVar5 < 10; iVar5 = iVar5 + 1) {
        for (; pW[2] = iVar7, iVar8 = iVar7, iVar7 < 10; iVar7 = iVar7 + 1) {
          for (; pW[1] = iVar8, iVar9 = iVar8, iVar8 < 10; iVar8 = iVar8 + 1) {
            for (; *pW = iVar9, iVar9 < 10; iVar9 = iVar9 + 1) {
              iVar6 = 0;
              iVar10 = 10000;
              uVar11 = 0;
              do {
                m = (int)uVar11;
                if (m == 0x40) {
                  if (iVar6 < iVar10) {
                    return iVar10;
                  }
                  __assert_fail("Lmax < Lmin",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddThresh.c"
                                ,0x10a,"int Extra_ThreshSelectWeights6(word *, int, int *)");
                }
                uVar1 = t[uVar11 >> 6];
                iVar2 = Extra_ThreshWeightedSum(pW,6,m);
                if ((uVar1 >> (uVar11 & 0x3f) & 1) == 0) {
                  if (iVar6 <= iVar2) {
                    iVar6 = iVar2;
                  }
                }
                else if (iVar2 <= iVar10) {
                  iVar10 = iVar2;
                }
                uVar11 = (ulong)(m + 1);
              } while (iVar6 < iVar10);
            }
          }
        }
      }
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

int Extra_ThreshSelectWeights6(word * t, int nVars, int * pW) {
    int m, Lmin, Lmax, nMints = (1 << nVars), Limit = nVars + 3;
    assert(nVars == 6);
    for (pW[5] = 1; pW[5] <= Limit; pW[5]++)
        for (pW[4] = pW[5]; pW[4] <= Limit; pW[4]++)
            for (pW[3] = pW[4]; pW[3] <= Limit; pW[3]++)
                for (pW[2] = pW[3]; pW[2] <= Limit; pW[2]++)
                    for (pW[1] = pW[2]; pW[1] <= Limit; pW[1]++)
                        for (pW[0] = pW[1]; pW[0] <= Limit; pW[0]++) {
                            Lmin = 10000;
                            Lmax = 0;
                            for (m = 0; m < nMints; m++) {
                                if (Abc_TtGetBit(t, m))
                                    Lmin = Abc_MinInt(Lmin,
                                            Extra_ThreshWeightedSum(pW, nVars,
                                                    m));
                                else
                                    Lmax = Abc_MaxInt(Lmax,
                                            Extra_ThreshWeightedSum(pW, nVars,
                                                    m));
                                if (Lmax >= Lmin)
                                    break;
                            }
                            if (m < nMints)
                                continue;
                            assert(Lmax < Lmin);
                            return Lmin;
                        }
    return 0;
}